

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O0

UnaryOperator * __thiscall
soul::PoolAllocator::
allocate<soul::heart::UnaryOperator,soul::CodeLocation,soul::heart::Expression&,soul::UnaryOp::Op&>
          (PoolAllocator *this,CodeLocation *args,Expression *args_1,Op *args_2)

{
  UTF8Reader *this_00;
  SourceCodeText *pSVar1;
  _lambda_void___1_ local_55 [13];
  CodeLocation local_48;
  UnaryOperator *local_38;
  UnaryOperator *newObject;
  PoolItem *newItem;
  Op *args_local_2;
  Expression *args_local_1;
  CodeLocation *args_local;
  PoolAllocator *this_local;
  
  newItem = (PoolItem *)args_2;
  args_local_2 = (Op *)args_1;
  args_local_1 = (Expression *)args;
  args_local = (CodeLocation *)this;
  newObject = (UnaryOperator *)allocateSpaceForObject(this,0x28);
  this_00 = &(newObject->super_Expression).super_Object.location.location;
  CodeLocation::CodeLocation(&local_48,(CodeLocation *)args_local_1);
  heart::UnaryOperator::UnaryOperator
            ((UnaryOperator *)this_00,&local_48,(Expression *)args_local_2,(Op)newItem->size);
  CodeLocation::~CodeLocation(&local_48);
  local_38 = (UnaryOperator *)this_00;
  pSVar1 = (SourceCodeText *)
           allocate(soul::CodeLocation&&,soul::heart::Expression&,soul::UnaryOp::Op&)::
           {lambda(void*)#1}::operator_cast_to_function_pointer(local_55);
  (newObject->super_Expression).super_Object.location.sourceCode.object = pSVar1;
  return local_38;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }